

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

void pbrt::HaltonSampler::extendedGCD(uint64_t a,uint64_t b,int64_t *x,int64_t *y)

{
  int64_t iVar1;
  int64_t yp;
  int64_t xp;
  
  if (b == 0) {
    yp = 1;
    iVar1 = 0;
  }
  else {
    extendedGCD(b,a % b,&xp,&yp);
    iVar1 = xp - (a / b) * yp;
  }
  *x = yp;
  *y = iVar1;
  return;
}

Assistant:

static void extendedGCD(uint64_t a, uint64_t b, int64_t *x, int64_t *y) {
        if (b == 0) {
            *x = 1;
            *y = 0;
            return;
        }
        int64_t d = a / b, xp, yp;
        extendedGCD(b, a % b, &xp, &yp);
        *x = yp;
        *y = xp - (d * yp);
    }